

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typebase.cpp
# Opt level: O2

string * __thiscall
ICM::TypeBase::DisperseType::to_string_abi_cxx11_(string *__return_storage_ptr__,DisperseType *this)

{
  pointer ppOVar1;
  ObjectPtr *in_RDX;
  ObjectPtr *obj;
  pointer ppOVar2;
  Object *local_58;
  string local_50;
  
  ppOVar2 = (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppOVar1 = (this->data).super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (ppOVar2 != ppOVar1) {
    local_58 = *ppOVar2;
    ICM::to_string_abi_cxx11_(&local_50,(ICM *)&local_58,in_RDX);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_50);
    while (ppOVar2 = ppOVar2 + 1, ppOVar2 != ppOVar1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      local_58 = *ppOVar2;
      ICM::to_string_abi_cxx11_(&local_50,(ICM *)&local_58,obj);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string DisperseType::to_string() const {
			return Convert::to_string(data.begin(), data.end(), [](const ObjectPtr &op) { return ICM::to_string(op); });
		}